

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O3

void TestAssignPowerUInt16(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char buffer [1024];
  Bignum bignum;
  char local_628;
  char cStack_627;
  char cStack_626;
  char cStack_625;
  char cStack_624;
  char cStack_623;
  char cStack_622;
  char cStack_621;
  char cStack_620;
  char cStack_61f;
  char cStack_61e;
  char cStack_61d;
  char cStack_61c;
  char cStack_61b;
  char cStack_61a;
  char cStack_619;
  char local_618;
  char cStack_617;
  char cStack_616;
  char cStack_615;
  char cStack_614;
  char cStack_613;
  char cStack_612;
  char cStack_611;
  char cStack_610;
  char cStack_60f;
  char cStack_60e;
  char cStack_60d;
  char cStack_60c;
  char cStack_60b;
  char cStack_60a;
  char cStack_609;
  Bignum local_21c;
  
  local_21c.used_bigits_ = 0;
  local_21c.exponent_ = 0;
  double_conversion::Bignum::AssignPowerUInt16(&local_21c,1,0);
  bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
  if (!bVar1) {
    uVar4 = 0x578;
LAB_00827f74:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar4,"bignum.ToHexString(buffer, kBufferSize)");
    abort();
  }
  if (CONCAT11(cStack_627,local_628) == 0x31) {
    double_conversion::Bignum::AssignPowerUInt16(&local_21c,1,1);
    bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
    if (!bVar1) {
      uVar4 = 0x57c;
      goto LAB_00827f74;
    }
    if (CONCAT11(cStack_627,local_628) == 0x31) {
      double_conversion::Bignum::AssignPowerUInt16(&local_21c,1,2);
      bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
      if (!bVar1) {
        uVar4 = 0x580;
        goto LAB_00827f74;
      }
      if (CONCAT11(cStack_627,local_628) == 0x31) {
        double_conversion::Bignum::AssignPowerUInt16(&local_21c,2,0);
        bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
        if (!bVar1) {
          uVar4 = 0x584;
          goto LAB_00827f74;
        }
        if (CONCAT11(cStack_627,local_628) == 0x31) {
          double_conversion::Bignum::AssignPowerUInt16(&local_21c,2,1);
          bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
          if (!bVar1) {
            uVar4 = 0x588;
            goto LAB_00827f74;
          }
          if (CONCAT11(cStack_627,local_628) == 0x32) {
            double_conversion::Bignum::AssignPowerUInt16(&local_21c,2,2);
            bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
            if (!bVar1) {
              uVar4 = 0x58c;
              goto LAB_00827f74;
            }
            if (CONCAT11(cStack_627,local_628) == 0x34) {
              double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,1);
              bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
              if (!bVar1) {
                uVar4 = 0x590;
                goto LAB_00827f74;
              }
              if (cStack_626 == '\0' && CONCAT11(cStack_627,local_628) == 0x3031) {
                double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,2);
                bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
                if (!bVar1) {
                  uVar4 = 0x594;
                  goto LAB_00827f74;
                }
                if (CONCAT13(cStack_625,CONCAT12(cStack_626,CONCAT11(cStack_627,local_628))) ==
                    0x303031) {
                  double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,5);
                  bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
                  if (!bVar1) {
                    uVar4 = 0x598;
                    goto LAB_00827f74;
                  }
                  if (CONCAT13(cStack_622,CONCAT12(cStack_623,CONCAT11(cStack_624,cStack_625))) ==
                      0x303030 &&
                      CONCAT13(cStack_625,CONCAT12(cStack_626,CONCAT11(cStack_627,local_628))) ==
                      0x30303031) {
                    double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,8);
                    bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
                    if (!bVar1) {
                      uVar4 = 0x59c;
                      goto LAB_00827f74;
                    }
                    if (CONCAT11(cStack_61f,cStack_620) == 0x30 &&
                        CONCAT17(cStack_621,
                                 CONCAT16(cStack_622,
                                          CONCAT15(cStack_623,
                                                   CONCAT14(cStack_624,
                                                            CONCAT13(cStack_625,
                                                                     CONCAT12(cStack_626,
                                                                              CONCAT11(cStack_627,
                                                                                       local_628))))
                                                  ))) == 0x3030303030303031) {
                      double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,0x10);
                      bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
                      if (!bVar1) {
                        uVar4 = 0x5a0;
                        goto LAB_00827f74;
                      }
                      auVar6[0] = -(local_628 == '1');
                      auVar6[1] = -(cStack_627 == '0');
                      auVar6[2] = -(cStack_626 == '0');
                      auVar6[3] = -(cStack_625 == '0');
                      auVar6[4] = -(cStack_624 == '0');
                      auVar6[5] = -(cStack_623 == '0');
                      auVar6[6] = -(cStack_622 == '0');
                      auVar6[7] = -(cStack_621 == '0');
                      auVar6[8] = -(cStack_620 == '0');
                      auVar6[9] = -(cStack_61f == '0');
                      auVar6[10] = -(cStack_61e == '0');
                      auVar6[0xb] = -(cStack_61d == '0');
                      auVar6[0xc] = -(cStack_61c == '0');
                      auVar6[0xd] = -(cStack_61b == '0');
                      auVar6[0xe] = -(cStack_61a == '0');
                      auVar6[0xf] = -(cStack_619 == '0');
                      auVar10[0] = -((char)_local_618 == '0');
                      auVar10[1] = -((char)((ushort)_local_618 >> 8) == '\0');
                      auVar10[2] = 0xff;
                      auVar10[3] = 0xff;
                      auVar10[4] = 0xff;
                      auVar10[5] = 0xff;
                      auVar10[6] = 0xff;
                      auVar10[7] = 0xff;
                      auVar10[8] = 0xff;
                      auVar10[9] = 0xff;
                      auVar10[10] = 0xff;
                      auVar10[0xb] = 0xff;
                      auVar10[0xc] = 0xff;
                      auVar10[0xd] = 0xff;
                      auVar10[0xe] = 0xff;
                      auVar10[0xf] = 0xff;
                      auVar10 = auVar10 & auVar6;
                      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
                        double_conversion::Bignum::AssignPowerUInt16(&local_21c,0x10,0x1e);
                        bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_628,0x400);
                        if (!bVar1) {
                          uVar4 = 0x5a4;
                          goto LAB_00827f74;
                        }
                        auVar7[0] = -(local_618 == '0');
                        auVar7[1] = -(cStack_617 == '0');
                        auVar7[2] = -(cStack_616 == '0');
                        auVar7[3] = -(cStack_615 == '0');
                        auVar7[4] = -(cStack_614 == '0');
                        auVar7[5] = -(cStack_613 == '0');
                        auVar7[6] = -(cStack_612 == '0');
                        auVar7[7] = -(cStack_611 == '0');
                        auVar7[8] = -(cStack_610 == '0');
                        auVar7[9] = -(cStack_60f == '0');
                        auVar7[10] = -(cStack_60e == '0');
                        auVar7[0xb] = -(cStack_60d == '0');
                        auVar7[0xc] = -(cStack_60c == '0');
                        auVar7[0xd] = -(cStack_60b == '0');
                        auVar7[0xe] = -(cStack_60a == '0');
                        auVar7[0xf] = -(cStack_609 == '\0');
                        auVar11[0] = -(local_628 == '1');
                        auVar11[1] = -(cStack_627 == '0');
                        auVar11[2] = -(cStack_626 == '0');
                        auVar11[3] = -(cStack_625 == '0');
                        auVar11[4] = -(cStack_624 == '0');
                        auVar11[5] = -(cStack_623 == '0');
                        auVar11[6] = -(cStack_622 == '0');
                        auVar11[7] = -(cStack_621 == '0');
                        auVar11[8] = -(cStack_620 == '0');
                        auVar11[9] = -(cStack_61f == '0');
                        auVar11[10] = -(cStack_61e == '0');
                        auVar11[0xb] = -(cStack_61d == '0');
                        auVar11[0xc] = -(cStack_61c == '0');
                        auVar11[0xd] = -(cStack_61b == '0');
                        auVar11[0xe] = -(cStack_61a == '0');
                        auVar11[0xf] = -(cStack_619 == '0');
                        auVar7 = auVar7 & auVar11;
                        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
                          double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,0);
                          bVar1 = double_conversion::Bignum::ToHexString
                                            (&local_21c,&local_628,0x400);
                          if (!bVar1) {
                            uVar4 = 0x5a8;
                            goto LAB_00827f74;
                          }
                          if (CONCAT11(cStack_627,local_628) == 0x31) {
                            double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,1);
                            bVar1 = double_conversion::Bignum::ToHexString
                                              (&local_21c,&local_628,0x400);
                            if (!bVar1) {
                              uVar4 = 0x5ac;
                              goto LAB_00827f74;
                            }
                            if (CONCAT11(cStack_627,local_628) == 0x41) {
                              double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,2);
                              bVar1 = double_conversion::Bignum::ToHexString
                                                (&local_21c,&local_628,0x400);
                              if (!bVar1) {
                                uVar4 = 0x5b0;
                                goto LAB_00827f74;
                              }
                              if (cStack_626 == '\0' && CONCAT11(cStack_627,local_628) == 0x3436) {
                                double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,5);
                                bVar1 = double_conversion::Bignum::ToHexString
                                                  (&local_21c,&local_628,0x400);
                                if (!bVar1) {
                                  uVar4 = 0x5b4;
                                  goto LAB_00827f74;
                                }
                                if (CONCAT11(cStack_623,cStack_624) == 0x30 &&
                                    CONCAT13(cStack_625,
                                             CONCAT12(cStack_626,CONCAT11(cStack_627,local_628))) ==
                                    0x41363831) {
                                  double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,8);
                                  bVar1 = double_conversion::Bignum::ToHexString
                                                    (&local_21c,&local_628,0x400);
                                  if (!bVar1) {
                                    uVar4 = 0x5b8;
                                    goto LAB_00827f74;
                                  }
                                  if (CONCAT17(cStack_621,
                                               CONCAT16(cStack_622,
                                                        CONCAT15(cStack_623,
                                                                 CONCAT14(cStack_624,
                                                                          CONCAT13(cStack_625,
                                                                                   CONCAT12(
                                                  cStack_626,CONCAT11(cStack_627,local_628))))))) ==
                                      0x30303145354635) {
                                    double_conversion::Bignum::AssignPowerUInt16(&local_21c,10,0x10)
                                    ;
                                    bVar1 = double_conversion::Bignum::ToHexString
                                                      (&local_21c,&local_628,0x400);
                                    if (!bVar1) {
                                      uVar4 = 0x5bc;
                                      goto LAB_00827f74;
                                    }
                                    if (CONCAT17(cStack_61a,
                                                 CONCAT16(cStack_61b,
                                                          CONCAT15(cStack_61c,
                                                                   CONCAT14(cStack_61d,
                                                                            CONCAT13(cStack_61e,
                                                                                     CONCAT12(
                                                  cStack_61f,CONCAT11(cStack_620,cStack_621)))))))
                                        == 0x30303030314346 &&
                                        CONCAT17(cStack_621,
                                                 CONCAT16(cStack_622,
                                                          CONCAT15(cStack_623,
                                                                   CONCAT14(cStack_624,
                                                                            CONCAT13(cStack_625,
                                                                                     CONCAT12(
                                                  cStack_626,CONCAT11(cStack_627,local_628))))))) ==
                                        0x4636324636383332) {
                                      double_conversion::Bignum::AssignPowerUInt16
                                                (&local_21c,10,0x1e);
                                      bVar1 = double_conversion::Bignum::ToHexString
                                                        (&local_21c,&local_628,0x400);
                                      if (!bVar1) {
                                        uVar4 = 0x5c0;
                                        goto LAB_00827f74;
                                      }
                                      auVar12[0] = -(cStack_61e == '6');
                                      auVar12[1] = -(cStack_61d == '7');
                                      auVar12[2] = -(cStack_61c == '4');
                                      auVar12[3] = -(cStack_61b == 'E');
                                      auVar12[4] = -(cStack_61a == 'D');
                                      auVar12[5] = -(cStack_619 == 'E');
                                      auVar12[6] = -(local_618 == 'A');
                                      auVar12[7] = -(cStack_617 == '4');
                                      auVar12[8] = -(cStack_616 == '0');
                                      auVar12[9] = -(cStack_615 == '0');
                                      auVar12[10] = -(cStack_614 == '0');
                                      auVar12[0xb] = -(cStack_613 == '0');
                                      auVar12[0xc] = -(cStack_612 == '0');
                                      auVar12[0xd] = -(cStack_611 == '0');
                                      auVar12[0xe] = -(cStack_610 == '0');
                                      auVar12[0xf] = -(cStack_60f == '\0');
                                      auVar8[0] = -(local_628 == 'C');
                                      auVar8[1] = -(cStack_627 == '9');
                                      auVar8[2] = -(cStack_626 == 'F');
                                      auVar8[3] = -(cStack_625 == '2');
                                      auVar8[4] = -(cStack_624 == 'C');
                                      auVar8[5] = -(cStack_623 == '9');
                                      auVar8[6] = -(cStack_622 == 'C');
                                      auVar8[7] = -(cStack_621 == 'D');
                                      auVar8[8] = -(cStack_620 == '0');
                                      auVar8[9] = -(cStack_61f == '4');
                                      auVar8[10] = -(cStack_61e == '6');
                                      auVar8[0xb] = -(cStack_61d == '7');
                                      auVar8[0xc] = -(cStack_61c == '4');
                                      auVar8[0xd] = -(cStack_61b == 'E');
                                      auVar8[0xe] = -(cStack_61a == 'D');
                                      auVar8[0xf] = -(cStack_619 == 'E');
                                      auVar8 = auVar8 & auVar12;
                                      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                                   (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                                   (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff
                                         ) {
                                        double_conversion::Bignum::AssignPowerUInt16
                                                  (&local_21c,10,0x1f);
                                        bVar1 = double_conversion::Bignum::ToHexString
                                                          (&local_21c,&local_628,0x400);
                                        if (!bVar1) {
                                          uVar4 = 0x5c4;
                                          goto LAB_00827f74;
                                        }
                                        auVar13[0] = -(cStack_61d == '0');
                                        auVar13[1] = -(cStack_61c == '9');
                                        auVar13[2] = -(cStack_61b == '1');
                                        auVar13[3] = -(cStack_61a == '4');
                                        auVar13[4] = -(cStack_619 == 'B');
                                        auVar13[5] = -(local_618 == '2');
                                        auVar13[6] = -(cStack_617 == '6');
                                        auVar13[7] = -(cStack_616 == '8');
                                        auVar13[8] = -(cStack_615 == '0');
                                        auVar13[9] = -(cStack_614 == '0');
                                        auVar13[10] = -(cStack_613 == '0');
                                        auVar13[0xb] = -(cStack_612 == '0');
                                        auVar13[0xc] = -(cStack_611 == '0');
                                        auVar13[0xd] = -(cStack_610 == '0');
                                        auVar13[0xe] = -(cStack_60f == '0');
                                        auVar13[0xf] = -(cStack_60e == '\0');
                                        auVar9[0] = -(local_628 == '7');
                                        auVar9[1] = -(cStack_627 == 'E');
                                        auVar9[2] = -(cStack_626 == '3');
                                        auVar9[3] = -(cStack_625 == '7');
                                        auVar9[4] = -(cStack_624 == 'B');
                                        auVar9[5] = -(cStack_623 == 'E');
                                        auVar9[6] = -(cStack_622 == '2');
                                        auVar9[7] = -(cStack_621 == '0');
                                        auVar9[8] = -(cStack_620 == '2');
                                        auVar9[9] = -(cStack_61f == '2');
                                        auVar9[10] = -(cStack_61e == 'C');
                                        auVar9[0xb] = -(cStack_61d == '0');
                                        auVar9[0xc] = -(cStack_61c == '9');
                                        auVar9[0xd] = -(cStack_61b == '1');
                                        auVar9[0xe] = -(cStack_61a == '4');
                                        auVar9[0xf] = -(cStack_619 == 'B');
                                        auVar9 = auVar9 & auVar13;
                                        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) ==
                                            0xffff) {
                                          double_conversion::Bignum::AssignPowerUInt16
                                                    (&local_21c,2,0);
                                          bVar1 = double_conversion::Bignum::ToHexString
                                                            (&local_21c,&local_628,0x400);
                                          if (!bVar1) {
                                            uVar4 = 0x5c8;
                                            goto LAB_00827f74;
                                          }
                                          if (CONCAT11(cStack_627,local_628) == 0x31) {
                                            double_conversion::Bignum::AssignPowerUInt16
                                                      (&local_21c,2,100);
                                            bVar1 = double_conversion::Bignum::ToHexString
                                                              (&local_21c,&local_628,0x400);
                                            if (!bVar1) {
                                              uVar4 = 0x5cc;
                                              goto LAB_00827f74;
                                            }
                                            auVar14[0] = -(local_628 == '1');
                                            auVar14[1] = -(cStack_627 == '0');
                                            auVar14[2] = -(cStack_626 == '0');
                                            auVar14[3] = -(cStack_625 == '0');
                                            auVar14[4] = -(cStack_624 == '0');
                                            auVar14[5] = -(cStack_623 == '0');
                                            auVar14[6] = -(cStack_622 == '0');
                                            auVar14[7] = -(cStack_621 == '0');
                                            auVar14[8] = -(cStack_620 == '0');
                                            auVar14[9] = -(cStack_61f == '0');
                                            auVar14[10] = -(cStack_61e == '0');
                                            auVar14[0xb] = -(cStack_61d == '0');
                                            auVar14[0xc] = -(cStack_61c == '0');
                                            auVar14[0xd] = -(cStack_61b == '0');
                                            auVar14[0xe] = -(cStack_61a == '0');
                                            auVar14[0xf] = -(cStack_619 == '0');
                                            auVar15[0] = -(cStack_61d == '0');
                                            auVar15[1] = -(cStack_61c == '0');
                                            auVar15[2] = -(cStack_61b == '0');
                                            auVar15[3] = -(cStack_61a == '0');
                                            auVar15[4] = -(cStack_619 == '0');
                                            auVar15[5] = -(local_618 == '0');
                                            auVar15[6] = -(cStack_617 == '0');
                                            auVar15[7] = -(cStack_616 == '0');
                                            auVar15[8] = -(cStack_615 == '0');
                                            auVar15[9] = -(cStack_614 == '0');
                                            auVar15[10] = -(cStack_613 == '0');
                                            auVar15[0xb] = -(cStack_612 == '0');
                                            auVar15[0xc] = -(cStack_611 == '0');
                                            auVar15[0xd] = -(cStack_610 == '0');
                                            auVar15[0xe] = -(cStack_60f == '0');
                                            auVar15[0xf] = -(cStack_60e == '\0');
                                            auVar14 = auVar14 & auVar15;
                                            if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                                         (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                                                         | (ushort)(SUB161(auVar14 >> 0x17,0) & 1)
                                                           << 2 | (ushort)(SUB161(auVar14 >> 0x1f,0)
                                                                          & 1) << 3 |
                                                         (ushort)(SUB161(auVar14 >> 0x27,0) & 1) <<
                                                         4 | (ushort)(SUB161(auVar14 >> 0x2f,0) & 1)
                                                             << 5 |
                                                         (ushort)(SUB161(auVar14 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar14 >> 0x3f,0) & 1)
                                                             << 7 |
                                                         (ushort)(SUB161(auVar14 >> 0x47,0) & 1) <<
                                                         8 | (ushort)(SUB161(auVar14 >> 0x4f,0) & 1)
                                                             << 9 |
                                                         (ushort)(SUB161(auVar14 >> 0x57,0) & 1) <<
                                                         10 | (ushort)(SUB161(auVar14 >> 0x5f,0) & 1
                                                                      ) << 0xb |
                                                         (ushort)(SUB161(auVar14 >> 0x67,0) & 1) <<
                                                         0xc | (ushort)(SUB161(auVar14 >> 0x6f,0) &
                                                                       1) << 0xd |
                                                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) <<
                                                         0xe | (ushort)(byte)(auVar14[0xf] >> 7) <<
                                                               0xf) == 0xffff) {
                                              double_conversion::Bignum::AssignPowerUInt16
                                                        (&local_21c,0x11,0);
                                              bVar1 = double_conversion::Bignum::ToHexString
                                                                (&local_21c,&local_628,0x400);
                                              if (!bVar1) {
                                                uVar4 = 0x5d0;
                                                goto LAB_00827f74;
                                              }
                                              if (CONCAT11(cStack_627,local_628) == 0x31) {
                                                double_conversion::Bignum::AssignPowerUInt16
                                                          (&local_21c,0x11,99);
                                                bVar1 = double_conversion::Bignum::ToHexString
                                                                  (&local_21c,&local_628,0x400);
                                                if (!bVar1) {
                                                  uVar4 = 0x5d4;
                                                  goto LAB_00827f74;
                                                }
                                                iVar2 = bcmp(
                                                  "1942BB9853FAD924A3D4DD92B89B940E0207BEF05DB9C26BC1B75780BE0C5A2C2990E02A681224F34ED68558CE4C6E33760931"
                                                  ,&local_628,0x67);
                                                if (iVar2 == 0) {
                                                  double_conversion::Bignum::AssignPowerUInt16
                                                            (&local_21c,0xffff,99);
                                                  bVar1 = double_conversion::Bignum::ToHexString
                                                                    (&local_21c,&local_628,0x400);
                                                  if (!bVar1) {
                                                    uVar4 = 0x5da;
                                                    goto LAB_00827f74;
                                                  }
                                                  iVar2 = bcmp(
                                                  "FF9D12F09B886C54E77E7439C7D2DED2D34F669654C0C2B6B8C2882505A2211D0E3DC9A61831349EAE674B11D56E3049D7BD79DAAD6C9FA2BA528E3A794299F2EE9146A324DAFE3E88967A0358233B543E233E575B9DD4E3AA7942146426C328FF55BFD5C45E0901B1629260AF9AE2F310C550959FAF305C30116D537D80CF6EBDBC15C5694062AF1AC3D956D0A41B7E1B79FF11E21D83387A1CE1F5882B31E4B5D8DE415BDBE6854466DF343362267A7E8833119D31D02E18DB5B0E8F6A64B0ED0D0062FFFF"
                                                  ,&local_628,0x18d);
                                                  if (iVar2 == 0) {
                                                    return;
                                                  }
                                                  pcVar3 = 
                                                  "\"FF9D12F09B886C54E77E7439C7D2DED2D34F669654C0C2B6B8C288250\" \"5A2211D0E3DC9A61831349EAE674B11D56E3049D7BD79DAAD6C9FA2BA\" \"528E3A794299F2EE9146A324DAFE3E88967A0358233B543E233E575B9\" \"DD4E3AA7942146426C328FF55BFD5C45E0901B1629260AF9AE2F310C5\" \"50959FAF305C30116D537D80CF6EBDBC15C5694062AF1AC3D956D0A41\" \"B7E1B79FF11E21D83387A1CE1F5882B31E4B5D8DE415BDBE6854466DF\" \"343362267A7E8833119D31D02E18DB5B0E8F6A64B0ED0D0062FFFF\""
                                                  ;
                                                  pcVar5 = 
                                                  "FF9D12F09B886C54E77E7439C7D2DED2D34F669654C0C2B6B8C2882505A2211D0E3DC9A61831349EAE674B11D56E3049D7BD79DAAD6C9FA2BA528E3A794299F2EE9146A324DAFE3E88967A0358233B543E233E575B9DD4E3AA7942146426C328FF55BFD5C45E0901B1629260AF9AE2F310C550959FAF305C30116D537D80CF6EBDBC15C5694062AF1AC3D956D0A41B7E1B79FF11E21D83387A1CE1F5882B31E4B5D8DE415BDBE6854466DF343362267A7E8833119D31D02E18DB5B0E8F6A64B0ED0D0062FFFF"
                                                  ;
                                                  uVar4 = 0x5e2;
                                                }
                                                else {
                                                  pcVar3 = 
                                                  "\"1942BB9853FAD924A3D4DD92B89B940E0207BEF05DB9C26BC1B757\" \"80BE0C5A2C2990E02A681224F34ED68558CE4C6E33760931\""
                                                  ;
                                                  pcVar5 = 
                                                  "1942BB9853FAD924A3D4DD92B89B940E0207BEF05DB9C26BC1B75780BE0C5A2C2990E02A681224F34ED68558CE4C6E33760931"
                                                  ;
                                                  uVar4 = 0x5d7;
                                                }
                                              }
                                              else {
                                                pcVar3 = "\"1\"";
                                                pcVar5 = "1";
                                                uVar4 = 0x5d1;
                                              }
                                            }
                                            else {
                                              pcVar3 = "\"10000000000000000000000000\"";
                                              pcVar5 = "10000000000000000000000000";
                                              uVar4 = 0x5cd;
                                            }
                                          }
                                          else {
                                            pcVar3 = "\"1\"";
                                            pcVar5 = "1";
                                            uVar4 = 0x5c9;
                                          }
                                        }
                                        else {
                                          pcVar3 = "\"7E37BE2022C0914B2680000000\"";
                                          pcVar5 = "7E37BE2022C0914B2680000000";
                                          uVar4 = 0x5c5;
                                        }
                                      }
                                      else {
                                        pcVar3 = "\"C9F2C9CD04674EDEA40000000\"";
                                        pcVar5 = "C9F2C9CD04674EDEA40000000";
                                        uVar4 = 0x5c1;
                                      }
                                    }
                                    else {
                                      pcVar3 = "\"2386F26FC10000\"";
                                      pcVar5 = "2386F26FC10000";
                                      uVar4 = 0x5bd;
                                    }
                                  }
                                  else {
                                    pcVar3 = "\"5F5E100\"";
                                    pcVar5 = "5F5E100";
                                    uVar4 = 0x5b9;
                                  }
                                }
                                else {
                                  pcVar3 = "\"186A0\"";
                                  pcVar5 = "186A0";
                                  uVar4 = 0x5b5;
                                }
                              }
                              else {
                                pcVar3 = "\"64\"";
                                pcVar5 = "64";
                                uVar4 = 0x5b1;
                              }
                            }
                            else {
                              pcVar3 = "\"A\"";
                              pcVar5 = "A";
                              uVar4 = 0x5ad;
                            }
                          }
                          else {
                            pcVar3 = "\"1\"";
                            pcVar5 = "1";
                            uVar4 = 0x5a9;
                          }
                        }
                        else {
                          pcVar3 = "\"1000000000000000000000000000000\"";
                          pcVar5 = "1000000000000000000000000000000";
                          uVar4 = 0x5a5;
                        }
                      }
                      else {
                        pcVar3 = "\"10000000000000000\"";
                        pcVar5 = "10000000000000000";
                        uVar4 = 0x5a1;
                      }
                    }
                    else {
                      pcVar3 = "\"100000000\"";
                      pcVar5 = "100000000";
                      uVar4 = 0x59d;
                    }
                  }
                  else {
                    pcVar3 = "\"100000\"";
                    pcVar5 = "100000";
                    uVar4 = 0x599;
                  }
                }
                else {
                  pcVar3 = "\"100\"";
                  pcVar5 = "100";
                  uVar4 = 0x595;
                }
              }
              else {
                pcVar3 = "\"10\"";
                pcVar5 = "10";
                uVar4 = 0x591;
              }
            }
            else {
              pcVar3 = "\"4\"";
              pcVar5 = "4";
              uVar4 = 0x58d;
            }
          }
          else {
            pcVar3 = "\"2\"";
            pcVar5 = "2";
            uVar4 = 0x589;
          }
        }
        else {
          pcVar3 = "\"1\"";
          pcVar5 = "1";
          uVar4 = 0x585;
        }
      }
      else {
        pcVar3 = "\"1\"";
        pcVar5 = "1";
        uVar4 = 0x581;
      }
    }
    else {
      pcVar3 = "\"1\"";
      pcVar5 = "1";
      uVar4 = 0x57d;
    }
  }
  else {
    pcVar3 = "\"1\"";
    pcVar5 = "1";
    uVar4 = 0x579;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar4,pcVar3,"buffer",pcVar5,&local_628);
  abort();
}

Assistant:

TEST(AssignPowerUInt16) {
  Bignum bignum;
  char buffer[kBufferSize];

  bignum.AssignPowerUInt16(1, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(1, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(1, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  bignum.AssignPowerUInt16(2, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("4", buffer);

  bignum.AssignPowerUInt16(16, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10", buffer);

  bignum.AssignPowerUInt16(16, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100", buffer);

  bignum.AssignPowerUInt16(16, 5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000", buffer);

  bignum.AssignPowerUInt16(16, 8);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000", buffer);

  bignum.AssignPowerUInt16(16, 16);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000", buffer);

  bignum.AssignPowerUInt16(16, 30);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000", buffer);

  bignum.AssignPowerUInt16(10, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(10, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  bignum.AssignPowerUInt16(10, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("64", buffer);

  bignum.AssignPowerUInt16(10, 5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("186A0", buffer);

  bignum.AssignPowerUInt16(10, 8);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("5F5E100", buffer);

  bignum.AssignPowerUInt16(10, 16);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2386F26FC10000", buffer);

  bignum.AssignPowerUInt16(10, 30);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("C9F2C9CD04674EDEA40000000", buffer);

  bignum.AssignPowerUInt16(10, 31);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("7E37BE2022C0914B2680000000", buffer);

  bignum.AssignPowerUInt16(2, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000", buffer);

  bignum.AssignPowerUInt16(17, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(17, 99);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1942BB9853FAD924A3D4DD92B89B940E0207BEF05DB9C26BC1B757"
           "80BE0C5A2C2990E02A681224F34ED68558CE4C6E33760931",
           buffer);

  bignum.AssignPowerUInt16(0xFFFF, 99);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FF9D12F09B886C54E77E7439C7D2DED2D34F669654C0C2B6B8C288250"
           "5A2211D0E3DC9A61831349EAE674B11D56E3049D7BD79DAAD6C9FA2BA"
           "528E3A794299F2EE9146A324DAFE3E88967A0358233B543E233E575B9"
           "DD4E3AA7942146426C328FF55BFD5C45E0901B1629260AF9AE2F310C5"
           "50959FAF305C30116D537D80CF6EBDBC15C5694062AF1AC3D956D0A41"
           "B7E1B79FF11E21D83387A1CE1F5882B31E4B5D8DE415BDBE6854466DF"
           "343362267A7E8833119D31D02E18DB5B0E8F6A64B0ED0D0062FFFF",
           buffer);
}